

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

date_t duckdb::TryCastCInternal<duckdb::timestamp_t,duckdb::date_t,duckdb::TryCast>
                 (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  date_t result_value;
  date_t local_c;
  
  bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>
                    ((timestamp_t)
                     *(int64_t *)((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_c,false);
  if (!bVar1) {
    local_c = FetchDefaultValue::Operation<duckdb::date_t>();
  }
  return (date_t)local_c.days;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}